

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelSizeCase::checkTextureState
          (TextureLevelSizeCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  deUint32 internalFormat;
  GLenum pname;
  pointer pTVar1;
  bool bVar2;
  pointer pTVar3;
  long lVar4;
  bool bVar5;
  int refValue;
  long lVar6;
  TextureFormat format;
  IVec4 channelBitDepth;
  TextureFormat local_58;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  CallLogWrapper *local_38;
  
  pTVar3 = (spec->levels).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (spec->levels).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar3 == pTVar1) {
    bVar5 = verifyTextureLevelParameterEqual
                      (gl,spec->queryTarget,0,this->m_pname,0,(this->super_TextureLevelCase).m_type)
    ;
    return bVar5;
  }
  bVar5 = true;
  if (0 < (int)((ulong)((long)pTVar1 - (long)pTVar3) >> 3) * -0x55555555) {
    lVar4 = 0x10;
    lVar6 = 0;
    local_38 = gl;
    do {
      local_4c = *(int *)((long)pTVar3 + lVar4 + -4);
      internalFormat = *(deUint32 *)((long)&pTVar3->width + lVar4);
      local_58 = glu::mapGLInternalFormat(internalFormat);
      tcu::getTextureFormatBitDepth((tcu *)&local_48,&local_58);
      pname = this->m_pname;
      if ((int)pname < 0x884a) {
        refValue = 0;
        switch(pname) {
        case 0x805c:
          if ((local_58.order < sBGR) && ((0xcba1U >> (local_58.order & (sBGR|sRGBA)) & 1) != 0)) {
LAB_014e6f2d:
            refValue = local_48;
          }
          break;
        case 0x805d:
          if ((local_58.order < sBGR) && ((0xcba0U >> (local_58.order & (sBGR|sRGBA)) & 1) != 0)) {
            refValue = local_44;
          }
          break;
        case 0x805e:
          if ((local_58.order < sBGR) && ((0xcb80U >> (local_58.order & (sBGR|sRGBA)) & 1) != 0)) {
            refValue = local_40;
          }
          break;
        case 0x805f:
          if ((local_58.order < sBGR) && ((0x8b00U >> (local_58.order & (sBGR|sRGBA)) & 1) != 0)) {
LAB_014e6f83:
            refValue = local_3c;
          }
        }
      }
      else if (pname == 0x884a) {
        if ((local_58.order == DS) || (refValue = 0, local_58.order == D)) goto LAB_014e6f2d;
      }
      else if (pname == 0x88f1) {
        refValue = 0;
        if (local_58.order == DS) goto LAB_014e6f83;
      }
      else {
        refValue = 0;
        if (pname == 0x8c3f) {
          refValue = (uint)(internalFormat == 0x8c3d) * 5;
        }
      }
      bVar2 = verifyTextureLevelParameterGreaterOrEqual
                        (local_38,spec->queryTarget,local_4c,pname,refValue,
                         (this->super_TextureLevelCase).m_type);
      bVar5 = (bool)(bVar5 & bVar2);
      lVar6 = lVar6 + 1;
      pTVar3 = (spec->levels).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0x18;
    } while (lVar6 < (int)((ulong)((long)(spec->levels).
                                         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3)
                          >> 3) * -0x55555555);
  }
  return bVar5;
}

Assistant:

bool TextureLevelSizeCase::checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
{
	bool allOk = true;

	if (spec.levels.empty())
	{
		allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, 0, m_pname, 0, m_type);
	}
	else
	{
		for (int levelNdx = 0; levelNdx < (int)spec.levels.size(); ++levelNdx)
		{
			const int queryLevel	= spec.levels[levelNdx].level;
			const int refValue		= getMinimumComponentResolution(spec.levels[levelNdx].internalFormat);

			allOk &= verifyTextureLevelParameterGreaterOrEqual(gl, spec.queryTarget, queryLevel, m_pname, refValue, m_type);
		}
	}

	return allOk;
}